

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::CodeHolder::attach(CodeHolder *this,BaseEmitter *emitter)

{
  long lVar1;
  Error EVar2;
  Error extraout_EAX;
  uint uVar3;
  uint uVar4;
  CodeHolder *pCVar5;
  CodeHolder *pCVar6;
  ulong uVar7;
  CodeHolder *pCVar8;
  CodeHolder *pCVar9;
  long lVar10;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar2 = 2;
  }
  else if ((byte)(emitter->_emitterType + ~kCompiler) < 0xfd) {
    EVar2 = 3;
  }
  else {
    uVar3._0_1_ = (this->_environment)._arch;
    uVar3._1_1_ = (this->_environment)._subArch;
    uVar3._2_1_ = (this->_environment)._vendor;
    uVar3._3_1_ = (this->_environment)._platform;
    if ((emitter->_archMask >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      EVar2 = 4;
    }
    else if (emitter->_code == (CodeHolder *)0x0) {
      EVar2 = 0;
      if (*(int *)&this->field_0xd4 == *(int *)&this->field_0xd0) {
        EVar2 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_emitters,&this->_allocator,8,1);
      }
      if ((EVar2 == 0) &&
         (pCVar5 = this, pCVar8 = (CodeHolder *)emitter,
         EVar2 = (*emitter->_vptr_BaseEmitter[0x10])(), EVar2 == 0)) {
        if (emitter->_code == this) {
          if (*(uint *)&this->field_0xd0 < *(uint *)&this->field_0xd4) {
            *(BaseEmitter **)(*(long *)&this->_emitters + (ulong)*(uint *)&this->field_0xd0 * 8) =
                 emitter;
            *(int *)&this->field_0xd0 = *(int *)&this->field_0xd0 + 1;
            return 0;
          }
        }
        else {
          attach();
        }
        attach();
        if (pCVar5 == (CodeHolder *)0x0) {
          EVar2 = 2;
        }
        else {
          if ((CodeHolder *)pCVar5->_logger == pCVar8) {
            if ((char)pCVar5->field_0x9 < '\0') {
              EVar2 = 0;
              pCVar6 = pCVar5;
              pCVar9 = pCVar8;
            }
            else {
              pCVar6 = pCVar8;
              pCVar9 = pCVar5;
              EVar2 = (**(code **)((long)pCVar5->_environment + 0x88))();
            }
            lVar1 = *(long *)&pCVar8->_emitters;
            uVar3 = *(uint *)&pCVar8->field_0xd0;
            uVar4 = 0xffffffff;
            if ((undefined1 *)(ulong)uVar3 != (undefined1 *)0x0) {
              pCVar6 = (CodeHolder *)0x0;
              do {
                if (*(CodeHolder **)(lVar1 + (long)pCVar6 * 8) == pCVar5) {
                  uVar4 = (uint)pCVar6;
                  break;
                }
                pCVar6 = (CodeHolder *)&(pCVar6->_environment)._subArch;
              } while ((CodeHolder *)(ulong)uVar3 != pCVar6);
            }
            if (uVar4 == 0xffffffff) {
              detach();
            }
            else if (uVar4 < uVar3) {
              uVar3 = uVar3 - 1;
              *(uint *)&pCVar8->field_0xd0 = uVar3;
              if (uVar3 != uVar4) {
                uVar7 = (ulong)uVar4;
                memmove((void *)(lVar1 + uVar7 * 8),(void *)(lVar1 + uVar7 * 8 + 8),
                        (uVar3 - uVar7) * 8);
              }
              pCVar5->_logger = (Logger *)0x0;
              return EVar2;
            }
            detach();
            pCVar9->_logger = (Logger *)pCVar6;
            uVar3 = *(uint *)&pCVar9->field_0xd0;
            EVar2 = extraout_EAX;
            if ((ulong)uVar3 != 0) {
              lVar1 = *(long *)&pCVar9->_emitters;
              lVar10 = 0;
              do {
                EVar2 = (**(code **)(**(long **)(lVar1 + lVar10) + 0x90))();
                lVar10 = lVar10 + 8;
              } while ((ulong)uVar3 << 3 != lVar10);
            }
            return EVar2;
          }
          EVar2 = 3;
        }
        return EVar2;
      }
    }
    else {
      EVar2 = (uint)(emitter->_code != this) * 3;
    }
  }
  return EVar2;
}

Assistant:

Error CodeHolder::attach(BaseEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  // Invalid emitter, this should not be possible.
  EmitterType type = emitter->emitterType();
  if (ASMJIT_UNLIKELY(type == EmitterType::kNone || uint32_t(type) > uint32_t(EmitterType::kMaxValue)))
    return DebugUtils::errored(kErrorInvalidState);

  uint64_t archMask = emitter->_archMask;
  if (ASMJIT_UNLIKELY(!(archMask & (uint64_t(1) << uint32_t(arch())))))
    return DebugUtils::errored(kErrorInvalidArch);

  // This is suspicious, but don't fail if `emitter` is already attached
  // to this code holder. This is not error, but it's not recommended.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Reserve the space now as we cannot fail after `onAttach()` succeeded.
  ASMJIT_PROPAGATE(_emitters.willGrow(&_allocator, 1));
  ASMJIT_PROPAGATE(emitter->onAttach(this));

  // Connect CodeHolder <-> BaseEmitter.
  ASMJIT_ASSERT(emitter->_code == this);
  _emitters.appendUnsafe(emitter);

  return kErrorOk;
}